

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsHessian_ASA_FSA.c
# Opt level: O1

int f(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  double *pdVar5;
  
  dVar1 = *(double *)((long)user_data + 8);
  pdVar4 = *(double **)((long)y->content + 0x10);
  dVar2 = pdVar4[1];
  dVar3 = pdVar4[2];
  pdVar5 = *(double **)((long)ydot->content + 0x10);
  *pdVar5 = -*user_data * *pdVar4 * *pdVar4 - dVar3;
  pdVar5[1] = -dVar2;
  pdVar5[2] = -dVar1 * dVar1 * dVar2 * dVar3;
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  sunrealtype y1, y2, y3;
  UserData data;
  sunrealtype p1, p2;

  data = (UserData)user_data;
  p1   = data->p1;
  p2   = data->p2;

  y1 = Ith(y, 1);
  y2 = Ith(y, 2);
  y3 = Ith(y, 3);

  Ith(ydot, 1) = -p1 * y1 * y1 - y3;
  Ith(ydot, 2) = -y2;
  Ith(ydot, 3) = -p2 * p2 * y2 * y3;

  return (0);
}